

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Node::dump_abi_cxx11_(Node *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Node *in_stack_00000078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_90 [24];
  Node *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  dotName_abi_cxx11_(in_stack_ffffffffffffff88);
  std::operator+(__lhs,(char *)in_RDI);
  label_abi_cxx11_(in_stack_00000078);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  return __lhs;
}

Assistant:

string Node::dump() const {
    return this->dotName() + " " + this->label() + "\n";
}